

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O1

TPZSFMatrix<long_double> * __thiscall
TPZSFMatrix<long_double>::operator+=(TPZSFMatrix<long_double> *this,TPZMatrix<long_double> *A)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int extraout_var_01;
  undefined4 extraout_var_02;
  longdouble *plVar8;
  longdouble *plVar9;
  int64_t r;
  long lVar10;
  long lVar11;
  long lVar12;
  longdouble in_ST0;
  longdouble lVar13;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  
  iVar6 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  iVar7 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(A);
  if (CONCAT44(extraout_var,iVar6) != CONCAT44(extraout_var_00,iVar7)) {
    TPZMatrix<long_double>::Error
              ("TPZSFMatrix<TVar> &TPZSFMatrix<long double>::operator+=(const TPZMatrix<TVar> &) [TVar = long double]"
               ,"Operator+= (TPZMatrix<>&) <different dimensions>");
  }
  plVar8 = this->fElem;
  iVar6 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if (CONCAT44(extraout_var_01,iVar6) != 0 && -1 < extraout_var_01) {
    lVar11 = 1;
    lVar12 = 0;
    do {
      lVar10 = 0;
      plVar9 = plVar8;
      lVar13 = in_ST0;
      lVar1 = in_ST1;
      lVar2 = in_ST2;
      lVar3 = in_ST3;
      lVar4 = in_ST4;
      lVar5 = in_ST5;
      in_ST5 = in_ST6;
      do {
        in_ST4 = lVar5;
        in_ST3 = lVar4;
        in_ST2 = lVar3;
        in_ST1 = lVar2;
        in_ST0 = lVar1;
        (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(A,lVar10,lVar12);
        plVar8 = plVar9 + 1;
        *plVar9 = *plVar9 + lVar13;
        lVar10 = lVar10 + 1;
        plVar9 = plVar8;
        lVar13 = in_ST0;
        lVar1 = in_ST1;
        lVar2 = in_ST2;
        lVar3 = in_ST3;
        lVar4 = in_ST4;
        lVar5 = in_ST5;
      } while (lVar11 != lVar10);
      lVar12 = lVar12 + 1;
      in_ST6 = in_ST5;
      iVar6 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0xc])();
      lVar11 = lVar11 + 1;
    } while (lVar12 < CONCAT44(extraout_var_02,iVar6));
  }
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  return this;
}

Assistant:

TPZSFMatrix<TVar>  &
TPZSFMatrix<TVar> ::operator+=(const TPZMatrix<TVar>  &A )
{
	if (this->Dim() != A.Dim() )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__,"Operator+= (TPZMatrix<>&) <different dimensions>" );
	
	TVar *pm = fElem;
	for ( int64_t c = 0; c < this->Dim(); c++ )
		for ( int64_t r = 0; r <= c; r++ )
			*pm++ += A.Get( r, c );
	
	this->fDecomposed = 0;
	return( *this );
}